

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnsStats.cpp
# Opt level: O2

DomainEntry * __thiscall DomainEntry::CreateCopy(DomainEntry *this)

{
  uint uVar1;
  DomainEntry *this_00;
  char *__dest;
  ulong __n;
  
  this_00 = (DomainEntry *)operator_new(0x20);
  DomainEntry(this_00);
  uVar1 = this->domain_length;
  this_00->domain_length = uVar1;
  if (uVar1 != 0) {
    if (this_00->domain != (char *)0x0) {
      operator_delete__(this_00->domain);
      uVar1 = this->domain_length;
    }
    __n = (ulong)uVar1;
    __dest = (char *)operator_new__(__n + 1);
    this_00->domain = __dest;
    memcpy(__dest,this->domain,__n);
    __dest[__n] = '\0';
  }
  return this_00;
}

Assistant:

DomainEntry * DomainEntry::CreateCopy()
{
    DomainEntry * key = new DomainEntry();

    if (key != NULL)
    {
        key->domain_length = domain_length;
        if (domain_length > 0) {
            if (key->domain != NULL) {
                delete[] key->domain;
            }

            key->domain = new char[(size_t)domain_length+1];

            if (key->domain == NULL) {
                delete key;
                key = NULL;
            }
            else {
                memcpy(key->domain, domain, domain_length);
                key->domain[domain_length] = 0;
            }
        }
    }

    return key;
}